

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O0

void __thiscall
TTD::UnorderedArrayList<TTD::NSSnapValues::SlotArrayInfo,_2048UL>::Iterator::MoveNext
          (Iterator *this)

{
  UnorderedArrayListLink *pUVar1;
  Iterator *this_local;
  
  this->m_currEntry = this->m_currEntry + 1;
  if (this->m_currEntry == (this->m_currLink).CurrPos) {
    if ((this->m_currLink).Next == (UnorderedArrayListLink *)0x0) {
      this->m_currEntry = (SlotArrayInfo *)0x0;
    }
    else {
      pUVar1 = (this->m_currLink).Next;
      (this->m_currLink).CurrPos = pUVar1->CurrPos;
      (this->m_currLink).EndPos = pUVar1->EndPos;
      (this->m_currLink).BlockData = pUVar1->BlockData;
      (this->m_currLink).Next = pUVar1->Next;
      this->m_currEntry = (this->m_currLink).BlockData;
    }
  }
  return;
}

Assistant:

void MoveNext()
            {
                this->m_currEntry++;

                if (this->m_currEntry == this->m_currLink.CurrPos)
                {
                    if (this->m_currLink.Next == nullptr)
                    {
                        this->m_currEntry = nullptr;
                    }
                    else
                    {
                        this->m_currLink = *(this->m_currLink.Next);
                        this->m_currEntry = this->m_currLink.BlockData;
                    }
                }
            }